

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

void BasicTests::print_tree(string *savefolder,Graph *g)

{
  FILE *__stream;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  Vertex *pVVar5;
  size_type sVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  string local_140 [32];
  vector<Capacitor,_std::allocator<Capacitor>_> local_120;
  Edge *local_108;
  Edge *e;
  Vertex *v_aux;
  FILE *output_file_vertices_aux;
  FILE *output_file_edges_aux;
  string savename_v_aux;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [8];
  string savename_e_aux;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [48];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  Graph *local_18;
  Graph *g_local;
  string *savefolder_local;
  
  local_18 = g;
  g_local = (Graph *)savefolder;
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"mkdir ");
  std::operator+(local_38,(char *)local_58);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  system(pcVar4);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::operator+((char *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"mkdir ");
  std::operator+(local_88,(char *)local_a8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  system(pcVar4);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::operator+(local_c8,(char *)savefolder);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &output_file_edges_aux,(char *)savefolder);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  output_file_vertices_aux = (FILE *)fopen(pcVar4,"w");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  v_aux = (Vertex *)fopen(pcVar4,"w");
  for (e = (Edge *)Graph::get_verticesList(local_18); e != (Edge *)0x0;
      e = (Edge *)Vertex::getNext((Vertex *)e)) {
    for (local_108 = Vertex::getEdgesList((Vertex *)e); pVVar5 = v_aux, local_108 != (Edge *)0x0;
        local_108 = Edge::getNext(local_108)) {
      bVar1 = Edge::isClosed(local_108);
      __stream = output_file_vertices_aux;
      if (bVar1) {
        pVVar5 = Edge::getOrigin(local_108);
        uVar2 = Vertex::getID(pVVar5);
        pVVar5 = Edge::getDestiny(local_108);
        uVar3 = Vertex::getID(pVVar5);
        dVar7 = Edge::getActiveLoss(local_108);
        dVar8 = Edge::getActivePowerFlow(local_108);
        dVar9 = Edge::getReactiveLoss(local_108);
        dVar10 = Edge::getReactivePowerFlow(local_108);
        dVar11 = Edge::getResistance(local_108);
        dVar12 = Edge::getReactance(local_108);
        fprintf((FILE *)__stream,"%2d, %2d, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f\n",dVar7,dVar8,
                dVar9,dVar10,dVar11,dVar12,(ulong)uVar2,(ulong)uVar3);
      }
    }
    uVar2 = Vertex::getID((Vertex *)e);
    Vertex::getCapacitors(&local_120,(Vertex *)e);
    sVar6 = std::vector<Capacitor,_std::allocator<Capacitor>_>::size(&local_120);
    dVar7 = Vertex::getActivePower((Vertex *)e);
    dVar8 = Vertex::getReactivePower((Vertex *)e);
    dVar9 = Vertex::getVoltage((Vertex *)e);
    fprintf((FILE *)pVVar5,"%2d, %1d, %4.6f, %4.6f, %4.6f\n",dVar7,dVar8,dVar9,(ulong)uVar2,
            sVar6 & 0xffffffff);
    std::vector<Capacitor,_std::allocator<Capacitor>_>::~vector(&local_120);
  }
  fclose((FILE *)v_aux);
  fclose((FILE *)output_file_vertices_aux);
  std::operator+((char *)local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "python3 printTree.py ");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  system(pcVar4);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string((string *)&output_file_edges_aux);
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void BasicTests::print_tree(const string savefolder, Graph *g) {
    system(("mkdir " + savefolder + " -p").c_str());
    system(("mkdir " + savefolder + "/Originals -p").c_str());

    string savename_e_aux = savefolder + "/original_e_tree.csv";
    string savename_v_aux = savefolder + "/original_v_tree.csv";
    FILE *output_file_edges_aux = fopen((savename_e_aux).c_str(), "w");
    FILE *output_file_vertices_aux = fopen((savename_v_aux).c_str(), "w");

    for (Vertex *v_aux = g->get_verticesList(); v_aux != NULL; v_aux = v_aux->getNext()) {
        for (Edge *e = v_aux->getEdgesList(); e != NULL; e = e->getNext()) {
            if (e->isClosed())
                fprintf(output_file_edges_aux, "%2d, %2d, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f\n",
                        e->getOrigin()->getID(), e->getDestiny()->getID(), e->getActiveLoss(), e->getActivePowerFlow(),
                        e->getReactiveLoss(), e->getReactivePowerFlow(), e->getResistance(), e->getReactance());
        }
        fprintf(output_file_vertices_aux, "%2d, %1d, %4.6f, %4.6f, %4.6f\n",
                v_aux->getID(), (int) v_aux->getCapacitors().size(), v_aux->getActivePower(), v_aux->getReactivePower(),
                v_aux->getVoltage());
    }
    fclose(output_file_vertices_aux);
    fclose(output_file_edges_aux);
    system(("python3 printTree.py " + savefolder).c_str()); // plota grafico da rede
}